

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArrayIterator.cpp
# Opt level: O2

Var Js::JavascriptArrayIterator::EntryNext(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  ulong nValue;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptArrayIterator *pJVar7;
  JavascriptArray *pJVar8;
  TypedArrayBase *pTVar9;
  ulong uVar10;
  TypedArrayBase *pTVar11;
  IRecyclerVisitedObject IVar12;
  undefined4 extraout_var;
  JavascriptArray *pJVar13;
  DynamicObject *pDVar14;
  Var pvVar15;
  int in_stack_00000010;
  undefined1 local_58 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0x1a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a73ba7;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_58,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  bVar3 = ScriptContext::IsJsBuiltInEnabled(pSVar1);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0x1e,"(!scriptContext->IsJsBuiltInEnabled())",
                                "!scriptContext->IsJsBuiltInEnabled()");
    if (!bVar3) goto LAB_00a73ba7;
    *puVar5 = 0;
  }
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0x23,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a73ba7;
    *puVar5 = 0;
  }
  pvVar6 = Arguments::operator[]((Arguments *)local_58,0);
  bVar3 = VarIs<Js::JavascriptArrayIterator>(pvVar6);
  if (!bVar3) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ebf4,L"Array Iterator.prototype.next");
  }
  pJVar7 = VarTo<Js::JavascriptArrayIterator>(pvVar6);
  pvVar6 = (pJVar7->m_iterableObject).ptr;
  if (pvVar6 == (Var)0x0) goto LAB_00a73a1f;
  bVar3 = JavascriptArray::IsNonES5Array(pvVar6);
  if (bVar3) {
    pJVar8 = VarTo<Js::JavascriptArray>(pvVar6);
    iVar4 = (*(pJVar8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])(pJVar8);
    if (iVar4 != 0) goto LAB_00a738c7;
    bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar6);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                  ,0x3a,"(!VarIs<JavascriptCopyOnAccessNativeIntArray>(iterable))",
                                  "!VarIs<JavascriptCopyOnAccessNativeIntArray>(iterable)");
      if (!bVar3) goto LAB_00a73ba7;
      *puVar5 = 0;
    }
    pTVar11 = (TypedArrayBase *)JavascriptArray::FromAnyArray(pvVar6);
    uVar10 = (ulong)(pTVar11->super_ArrayBufferParent).super_ArrayObject.length;
LAB_00a7397f:
    pTVar9 = (TypedArrayBase *)0x0;
  }
  else {
LAB_00a738c7:
    bVar3 = VarIs<Js::TypedArrayBase>(pvVar6);
    if (!bVar3) {
      pvVar15 = JavascriptOperators::OP_GetLength(pvVar6,pSVar1);
      uVar10 = JavascriptConversion::ToLength(pvVar15,pSVar1);
      pTVar11 = (TypedArrayBase *)0x0;
      goto LAB_00a7397f;
    }
    pTVar9 = UnsafeVarTo<Js::TypedArrayBase>(pvVar6);
    if (((pTVar9->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached == true) {
      JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    uVar10 = (ulong)(pTVar9->super_ArrayBufferParent).super_ArrayObject.length;
    pTVar11 = (TypedArrayBase *)0x0;
  }
  nValue = pJVar7->m_nextIndex;
  if ((long)uVar10 <= (long)nValue) {
    (pJVar7->m_iterableObject).ptr = (void *)0x0;
LAB_00a73a1f:
    pDVar14 = JavascriptLibrary::CreateIteratorResultObjectDone(this);
    return pDVar14;
  }
  pJVar7->m_nextIndex = nValue + 1;
  if (pJVar7->m_kind == Key) {
    pJVar8 = (JavascriptArray *)JavascriptNumber::ToVar(nValue,pSVar1);
    goto LAB_00a73b6f;
  }
  if (pTVar11 == (TypedArrayBase *)0x0) {
    if (pTVar9 != (TypedArrayBase *)0x0) {
      if (0xffffffff < (long)nValue) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                    ,0x67,"(index <= 0xffffffff)","index <= UINT_MAX");
        if (!bVar3) goto LAB_00a73ba7;
        *puVar5 = 0;
      }
      IVar12._vptr_IRecyclerVisitedObject =
           (pTVar9->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
           _vptr_IRecyclerVisitedObject;
      goto LAB_00a73aae;
    }
    pvVar15 = JavascriptNumber::ToVar(nValue,pSVar1);
    pJVar8 = (JavascriptArray *)JavascriptOperators::OP_GetElementI(pvVar6,pvVar15,pSVar1);
  }
  else {
    if (0xffffffff < (long)nValue) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                  ,0x62,"(index <= 0xffffffff)","index <= UINT_MAX");
      if (!bVar3) goto LAB_00a73ba7;
      *puVar5 = 0;
    }
    IVar12._vptr_IRecyclerVisitedObject =
         (pTVar11->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
         super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
         _vptr_IRecyclerVisitedObject;
    pTVar9 = pTVar11;
LAB_00a73aae:
    iVar4 = (*IVar12._vptr_IRecyclerVisitedObject[0x72])(pTVar9,nValue & 0xffffffff);
    pJVar8 = (JavascriptArray *)CONCAT44(extraout_var,iVar4);
  }
  if (pJVar7->m_kind != KeyAndValue) {
    if (pJVar7->m_kind == Value) goto LAB_00a73b6f;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0x74,
                                "(iterator->m_kind == JavascriptArrayIteratorKind::KeyAndValue)",
                                "iterator->m_kind == JavascriptArrayIteratorKind::KeyAndValue");
    if (!bVar3) {
LAB_00a73ba7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pJVar13 = JavascriptLibrary::CreateArray(this,2);
  pvVar6 = JavascriptNumber::ToVar(nValue,pSVar1);
  (*(pJVar13->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])(pJVar13,0,pvVar6,0);
  (*(pJVar13->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])(pJVar13,1,pJVar8,0);
  pJVar8 = pJVar13;
LAB_00a73b6f:
  pDVar14 = JavascriptLibrary::CreateIteratorResultObject(this,pJVar8,false);
  return pDVar14;
}

Assistant:

Var JavascriptArrayIterator::EntryNext(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

#ifdef ENABLE_JS_BUILTINS
        Assert(!scriptContext->IsJsBuiltInEnabled());
#endif

        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        Var thisObj = args[0];

        if (!VarIs<JavascriptArrayIterator>(thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedArrayIterator, _u("Array Iterator.prototype.next"));
        }

        JavascriptArrayIterator* iterator = VarTo<JavascriptArrayIterator>(thisObj);
        Var iterable = iterator->m_iterableObject;

        if (iterable == nullptr)
        {
            return library->CreateIteratorResultObjectDone();
        }

        int64 length;
        JavascriptArray* pArr = nullptr;
        TypedArrayBase *typedArrayBase = nullptr;
        if (JavascriptArray::IsNonES5Array(iterable) && !VarTo<JavascriptArray>(iterable)->IsCrossSiteObject())
        {
#if ENABLE_COPYONACCESS_ARRAY
            Assert(!VarIs<JavascriptCopyOnAccessNativeIntArray>(iterable));
#endif
            pArr = JavascriptArray::FromAnyArray(iterable);
            length = pArr->GetLength();
        }
        else if (VarIs<TypedArrayBase>(iterable))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(iterable);
            if (typedArrayBase->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray);
            }

            length = typedArrayBase->GetLength();
        }
        else
        {
            length = JavascriptConversion::ToLength(JavascriptOperators::OP_GetLength(iterable, scriptContext), scriptContext);
        }

        int64 index = iterator->m_nextIndex;

        if (index >= length)
        {
            // Nulling out the m_iterableObject field is important so that the iterator
            // does not keep the iterable object alive after iteration is completed.
            iterator->m_iterableObject = nullptr;
            return library->CreateIteratorResultObjectDone();
        }

        iterator->m_nextIndex += 1;

        if (iterator->m_kind == JavascriptArrayIteratorKind::Key)
        {
            return library->CreateIteratorResultObject(JavascriptNumber::ToVar(index, scriptContext));
        }

        Var value;
        if (pArr != nullptr)
        {
            Assert(index <= UINT_MAX);
            value = pArr->DirectGetItem((uint32)index);
        }
        else if (typedArrayBase != nullptr)
        {
            Assert(index <= UINT_MAX);
            value = typedArrayBase->DirectGetItem((uint32)index);
        }
        else
        {
            value = JavascriptOperators::OP_GetElementI(iterable, JavascriptNumber::ToVar(index, scriptContext), scriptContext);
        }

        if (iterator->m_kind == JavascriptArrayIteratorKind::Value)
        {
            return library->CreateIteratorResultObject(value);
        }

        Assert(iterator->m_kind == JavascriptArrayIteratorKind::KeyAndValue);

        JavascriptArray* keyValueTuple = library->CreateArray(2);

        keyValueTuple->SetItem(0, JavascriptNumber::ToVar(index, scriptContext), PropertyOperation_None);
        keyValueTuple->SetItem(1, value, PropertyOperation_None);

        return library->CreateIteratorResultObject(keyValueTuple);
    }